

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O2

void __thiscall correctness_div_long_Test::TestBody(correctness_div_long_Test *this)

{
  char *message;
  AssertHelper AStack_198;
  AssertionResult gtest_ar;
  big_integer local_180;
  string local_148;
  string local_128;
  string local_108;
  big_integer c;
  big_integer b;
  big_integer local_78;
  big_integer a;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,
             "10000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000"
             ,(allocator<char> *)&b);
  big_integer::big_integer(&a,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,"100000000000000000000000000000000000000",(allocator<char> *)&c);
  big_integer::big_integer(&b,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"100000000000000000000000000000000000000000000000000000",
             (allocator<char> *)&local_180);
  big_integer::big_integer(&c,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  big_integer::big_integer(&local_78,&a);
  operator/(&local_180,&local_78,&b);
  testing::internal::CmpHelperEQ<big_integer,big_integer>
            ((internal *)&gtest_ar,"a / b","c",&local_180,&c);
  big_integer::~big_integer(&local_180);
  big_integer::~big_integer(&local_78);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_180);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/YaroslavZhurba[P]BigInt/big_integer_testing.cpp"
               ,0x222,message);
    testing::internal::AssertHelper::operator=(&AStack_198,(Message *)&local_180);
    testing::internal::AssertHelper::~AssertHelper(&AStack_198);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_180);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  big_integer::~big_integer(&c);
  big_integer::~big_integer(&b);
  big_integer::~big_integer(&a);
  return;
}

Assistant:

TEST(correctness, div_long)
{
    big_integer a("10000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000");
    big_integer b(                                                     "100000000000000000000000000000000000000");
    big_integer c("100000000000000000000000000000000000000000000000000000");

    EXPECT_EQ(a / b, c);
}